

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor_rational.hpp
# Opt level: O2

void __thiscall soplex::CLUFactorRational::eliminateColSingletons(CLUFactorRational *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Pring *pPVar5;
  int *piVar6;
  int *piVar7;
  int *piVar8;
  Pring *pPVar9;
  Pring *pPVar10;
  int *piVar11;
  int *piVar12;
  Pring *pPVar13;
  pointer pnVar14;
  int *piVar15;
  Pring *pPVar16;
  int iVar17;
  int *piVar18;
  long lVar19;
  long lVar20;
  int iVar21;
  
  pPVar16 = (this->temp).pivot_colNZ;
  pPVar5 = pPVar16 + 1;
  while( true ) {
    pPVar5 = pPVar5->prev;
    pPVar9 = pPVar16 + 1;
    if (pPVar5 == pPVar9) break;
    iVar1 = pPVar5->idx;
    piVar6 = (this->u).col.len;
    iVar2 = piVar6[iVar1];
    piVar6[iVar1] = iVar2 + -1;
    piVar7 = (this->u).col.idx;
    piVar8 = (this->u).col.start;
    iVar2 = piVar7[(long)piVar8[iVar1] + -1 + (long)iVar2];
    pPVar9 = (this->temp).pivot_row;
    pPVar10 = pPVar9[iVar2].next;
    pPVar9 = pPVar9[iVar2].prev;
    pPVar10->prev = pPVar9;
    pPVar9->next = pPVar10;
    piVar11 = (this->u).row.len;
    iVar17 = piVar11[iVar2] + -1;
    piVar11[iVar2] = iVar17;
    piVar11 = (this->u).row.idx;
    piVar12 = (this->temp).s_cact;
    pPVar9 = (this->temp).pivot_col;
    lVar19 = (long)(iVar17 + (this->u).row.start[iVar2]);
    for (lVar20 = lVar19; iVar17 = piVar11[lVar20], iVar17 != iVar1; lVar20 = lVar20 + -1) {
      iVar3 = piVar8[iVar17];
      iVar4 = piVar6[iVar17];
      iVar21 = piVar12[iVar17];
      piVar12[iVar17] = iVar21 + -1;
      iVar21 = (iVar3 + iVar4) - iVar21;
      piVar15 = piVar7 + iVar21;
      do {
        piVar18 = piVar15;
        piVar15 = piVar18 + 1;
      } while (*piVar18 != iVar2);
      *piVar18 = piVar7[iVar21];
      piVar7[iVar21] = iVar2;
      iVar3 = piVar12[iVar17];
      pPVar10 = pPVar9[iVar17].next;
      pPVar13 = pPVar9[iVar17].prev;
      pPVar10->prev = pPVar13;
      pPVar13->next = pPVar10;
      pPVar10 = pPVar16[iVar3].next;
      pPVar9[iVar17].next = pPVar10;
      pPVar10->prev = pPVar9 + iVar17;
      pPVar9[iVar17].prev = pPVar16 + iVar3;
      pPVar16[iVar3].next = pPVar9 + iVar17;
    }
    iVar17 = (this->temp).stage;
    (this->temp).stage = iVar17 + 1;
    setPivot(this,iVar17,iVar1,iVar2,
             (this->u).row.val.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
             ._M_impl.super__Vector_impl_data._M_start + lVar20);
    piVar6 = (this->u).row.idx;
    piVar6[lVar20] = piVar6[lVar19];
    pnVar14 = (this->u).row.val.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    boost::
    rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
    ::operator=((rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                 *)(pnVar14 + lVar20),
                (rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                 *)(pnVar14 + lVar19));
    piVar6 = (this->u).row.idx;
    iVar1 = (this->u).row.start[iVar2];
    piVar7 = (this->u).col.len;
    piVar8 = (this->u).col.start;
    piVar11 = (this->temp).s_cact;
    piVar12 = (this->u).col.idx;
    pPVar9 = (this->temp).pivot_col;
    pPVar16 = (this->temp).pivot_colNZ;
    while (iVar1 < lVar20) {
      lVar20 = lVar20 + -1;
      iVar17 = piVar6[lVar20];
      iVar3 = piVar8[iVar17];
      iVar4 = piVar7[iVar17];
      iVar21 = piVar11[iVar17];
      piVar11[iVar17] = iVar21 + -1;
      iVar21 = (iVar3 + iVar4) - iVar21;
      piVar15 = piVar12 + iVar21;
      do {
        piVar18 = piVar15;
        piVar15 = piVar18 + 1;
      } while (*piVar18 != iVar2);
      *piVar18 = piVar12[iVar21];
      piVar12[iVar21] = iVar2;
      iVar3 = piVar11[iVar17];
      pPVar10 = pPVar9[iVar17].next;
      pPVar13 = pPVar9[iVar17].prev;
      pPVar10->prev = pPVar13;
      pPVar13->next = pPVar10;
      pPVar10 = pPVar16[iVar3].next;
      pPVar9[iVar17].next = pPVar10;
      pPVar10->prev = pPVar9 + iVar17;
      pPVar9[iVar17].prev = pPVar16 + iVar3;
      pPVar16[iVar3].next = pPVar9 + iVar17;
    }
  }
  pPVar16[1].next = pPVar9;
  pPVar16[1].prev = pPVar9;
  return;
}

Assistant:

inline void CLUFactorRational::eliminateColSingletons()
{
   int i, j, k, m, c;
   int pcol, prow;
   CLUFactorRational::Pring* sing;

   for(sing = temp.pivot_colNZ[1].prev;
         sing != &(temp.pivot_colNZ[1]);
         sing = sing->prev)
   {
      /*      Find pivot value
       */
      pcol = sing->idx;
      j = --(u.col.len[pcol]) + u.col.start[pcol];   /* remove pivot column */
      prow = u.col.idx[j];
      removeDR(temp.pivot_row[prow]);

      j = --(u.row.len[prow]) + u.row.start[prow];

      for(i = j; (c = u.row.idx[i]) != pcol; --i)
      {
         m = u.col.len[c] + u.col.start[c] - (temp.s_cact[c])--;

         for(k = m; u.col.idx[k] != prow; ++k)
            ;

         u.col.idx[k] = u.col.idx[m];

         u.col.idx[m] = prow;

         m = temp.s_cact[c];

         removeDR(temp.pivot_col[c]);

         init2DR(temp.pivot_col[c], temp.pivot_colNZ[m]);

         assert(col.perm[c] < 0);
      }

      /*      remove pivot element from pivot row
       */
      setPivot(temp.stage++, pcol, prow, u.row.val[i]);

      u.row.idx[i] = u.row.idx[j];

      u.row.val[i] = u.row.val[j];

      j = u.row.start[prow];

      for(--i; i >= j; --i)
      {
         c = u.row.idx[i];
         m = u.col.len[c] + u.col.start[c] - (temp.s_cact[c])--;

         for(k = m; u.col.idx[k] != prow; ++k)
            ;

         u.col.idx[k] = u.col.idx[m];

         u.col.idx[m] = prow;

         m = temp.s_cact[c];

         removeDR(temp.pivot_col[c]);

         init2DR(temp.pivot_col[c], temp.pivot_colNZ[m]);

         assert(col.perm[c] < 0);
      }
   }

   initDR(temp.pivot_colNZ[1]);    /* Remove all column singletons from list */
}